

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O2

int Gia_LutWhereIsPin(Gia_Man_t *p,int iFanout,int iFanin,int *pPinPerm)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    iVar1 = Gia_ObjLutSize(p,iFanout);
    if (iVar1 <= lVar2) {
      return -1;
    }
    iVar1 = Gia_ObjLutFanin(p,iFanout,pPinPerm[lVar2]);
    if (iVar1 == iFanin) break;
    lVar2 = lVar2 + 1;
  }
  return (int)lVar2;
}

Assistant:

int Gia_LutWhereIsPin( Gia_Man_t * p, int iFanout, int iFanin, int * pPinPerm )
{
    int i;
    for ( i = 0; i < Gia_ObjLutSize(p, iFanout); i++ )
        if ( Gia_ObjLutFanin(p, iFanout, pPinPerm[i]) == iFanin )
            return i;
    return -1;
}